

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::cleanSpaces(string *unit_string,bool skipMultiply)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  iterator iVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  difference_type dVar11;
  byte in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type f2;
  size_type notspace;
  size_type oloc;
  size_type nloc;
  size_type fnd;
  bool spacesRemoved;
  undefined7 in_stack_fffffffffffffe78;
  char in_stack_fffffffffffffe7f;
  undefined7 in_stack_fffffffffffffe80;
  char in_stack_fffffffffffffe87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  size_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c1;
  allocator<char> local_99 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_71;
  byte local_4d;
  string local_39;
  byte local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = in_SIL & 1;
  local_10 = in_RDI;
  if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_),
     iVar5 != 0)) {
    in_stack_fffffffffffffec8 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
  }
  this_01 = &local_71;
  __s = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  bVar1 = isolatePriorModifier
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (char)((ulong)this_01 >> 0x38),(char)((ulong)this_01 >> 0x30));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_4d = bVar1 & 1;
  __first._M_current = (char *)local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffeb0));
  uVar2 = isolatePriorModifier
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                     (char)((ulong)this_01 >> 0x38),(char)((ulong)this_01 >> 0x30));
  local_4d = local_4d & 1 | uVar2;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::allocator<char>::~allocator(local_99);
  this_00 = &local_c1;
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s,(allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffeb0));
  uVar3 = isolatePostModifier(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_4d = (local_4d & 1) != 0 || (bool)uVar3;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar3,in_stack_fffffffffffffe80));
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_d0 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __first._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
LAB_007a6883:
  if (local_d0 == 0xffffffffffffffff) {
    return (bool)(local_4d & 1);
  }
  local_4d = 1;
  if ((local_d0 != 0) && ((local_11 & 1) == 0)) {
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __first._M_current,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
    if (sVar6 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (this_00,(size_type)this,CONCAT17(uVar3,in_stack_fffffffffffffe80));
      return true;
    }
    if (local_d0 == 1) {
      pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar3,in_stack_fffffffffffffe80),
                          CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      bVar4 = isOperator(*pvVar7);
      if (((bVar4) ||
          (pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(uVar3,in_stack_fffffffffffffe80),
                                 CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)),
          *pvVar7 == '^')) ||
         (pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar3,in_stack_fffffffffffffe80),
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)),
         *pvVar7 == '@')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (this_00,(size_type)this,CONCAT17(uVar3,in_stack_fffffffffffffe80));
        local_d0 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __first._M_current,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
      }
      else {
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
        if (sVar8 < 8) {
          pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar3,in_stack_fffffffffffffe80),
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
          *pvVar7 = '*';
          local_d0 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__first._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
          local_11 = 1;
        }
        else {
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar3,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7f
                                ,0x7a6b62);
          if ((sVar8 != 0xffffffffffffffff) ||
             (sVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__first._M_current,
                                    (char *)CONCAT17(uVar2,in_stack_fffffffffffffe98),
                                    (size_type)this_00), 8 < sVar8)) goto LAB_007a6be4;
          pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar3,in_stack_fffffffffffffe80),
                              CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
          *pvVar7 = '*';
          local_d0 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__first._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
          local_11 = 1;
        }
      }
      goto LAB_007a6883;
    }
LAB_007a6be4:
    pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(uVar3,in_stack_fffffffffffffe80),
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    bVar4 = isOperator(*pvVar7);
    if (bVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (this_00,(size_type)this,CONCAT17(uVar3,in_stack_fffffffffffffe80));
      local_d0 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __first._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
      goto LAB_007a6883;
    }
    pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(uVar3,in_stack_fffffffffffffe80),
                        CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    if (*pvVar7 == '.') {
      local_d0 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __first._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
      goto LAB_007a6883;
    }
    sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10
                      );
    if (sVar6 < sVar8) {
      pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar3,in_stack_fffffffffffffe80),
                          CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      bVar4 = isOperator(*pvVar7);
      if (bVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (this_00,(size_type)this,CONCAT17(uVar3,in_stack_fffffffffffffe80));
        local_d0 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __first._M_current,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
        goto LAB_007a6883;
      }
    }
    iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    _Var10 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this,CONCAT17(uVar3,in_stack_fffffffffffffe80));
    bVar4 = std::
            all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,units::cleanSpaces(std::__cxx11::string&,bool)::__0>
                      (iVar9._M_current,_Var10._M_current);
    if (bVar4) {
      pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar3,in_stack_fffffffffffffe80),
                          CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      *pvVar7 = '*';
      local_d0 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __first._M_current,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
      local_11 = 1;
      goto LAB_007a6883;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this,CONCAT17(uVar3,in_stack_fffffffffffffe80));
    _Var10._M_current._7_1_ = uVar2;
    _Var10._M_current._0_7_ = in_stack_fffffffffffffe98;
    dVar11 = std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (__first,_Var10,(char *)this_00);
    if (((dVar11 == 1) &&
        (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __first._M_current,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe98),
                       (size_type)this_00), sVar6 == 0xffffffffffffffff)) &&
       (sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __first._M_current,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe98),
                      (size_type)this_00), sVar6 == 0xffffffffffffffff)) {
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__first._M_current,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __first._M_current,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe98),
                            (size_type)this_00);
      if ((sVar6 != 0xffffffffffffffff) && (sVar8 != sVar6)) {
        pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar3,in_stack_fffffffffffffe80),
                            CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        bVar4 = isDigitCharacter(*pvVar7);
        if (bVar4) goto LAB_007a6f3e;
        pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar3,in_stack_fffffffffffffe80),
                            CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
        *pvVar7 = '*';
        local_11 = 1;
        local_d0 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __first._M_current,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
        goto LAB_007a6883;
      }
    }
  }
LAB_007a6f3e:
  if (((local_d0 == 0) ||
      (pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar3,in_stack_fffffffffffffe80),
                           CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78)),
      *pvVar7 != '.')) &&
     (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (this_00,(size_type)this,CONCAT17(uVar3,in_stack_fffffffffffffe80)), local_d0 != 0))
  {
    local_11 = 1;
  }
  local_d0 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __first._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar2,in_stack_fffffffffffffe98),(size_type)this_00);
  goto LAB_007a6883;
}

Assistant:

static bool cleanSpaces(std::string& unit_string, bool skipMultiply)
{
    static const std::string spaceChars = std::string(" \t\n\r") + '\0';

    bool spacesRemoved = isolatePriorModifier(unit_string, "square ", 'd', 'D');
    spacesRemoved |= isolatePriorModifier(unit_string, "cubic ", '_', '-');
    spacesRemoved |= isolatePostModifier(unit_string, " squared");
    auto fnd = unit_string.find_first_of(spaceChars);
    while (fnd != std::string::npos) {
        spacesRemoved = true;
        if ((fnd > 0) && (!skipMultiply)) {
            auto nloc = unit_string.find_first_not_of(spaceChars, fnd);
            if (nloc == std::string::npos) {
                unit_string.erase(fnd);
                return true;
            }
            if (fnd == 1) {  // if the second character is a space it almost
                             // always means multiply
                if (isOperator(unit_string[nloc]) || unit_string[nloc] == '^' ||
                    unit_string[nloc] == '@') {
                    unit_string.erase(fnd, 1);
                    fnd = unit_string.find_first_of(spaceChars, fnd);
                    continue;
                }

                if (unit_string.size() < 8) {
                    unit_string[fnd] = '*';
                    fnd = unit_string.find_first_of(spaceChars, fnd);
                    skipMultiply = true;
                    continue;
                }
                if (unit_string.find_first_of('*') == std::string::npos) {
                    auto oloc = unit_string.find_first_of("/^", nloc);
                    if (oloc < 9) {
                        unit_string[fnd] = '*';
                        fnd = unit_string.find_first_of(spaceChars, fnd);
                        skipMultiply = true;
                        continue;
                    }
                }
            }
            if (isOperator(unit_string[fnd - 1])) {
                unit_string.erase(fnd, 1);
                fnd = unit_string.find_first_of(spaceChars, fnd);
                continue;
            }
            if (unit_string[fnd - 1] == '.') {
                // this is an abbreviation so deal with it later
                fnd = unit_string.find_first_of(spaceChars, fnd + 1);
                continue;
            }
            if (unit_string.size() > nloc && isOperator(unit_string[nloc])) {
                unit_string.erase(fnd, 1);
                fnd = unit_string.find_first_of(spaceChars, fnd);
                continue;
            }
            if (std::all_of(
                    unit_string.begin(), unit_string.begin() + fnd, [](char X) {
                        return isNumericalStartCharacter(X) || isOperator(X);
                    })) {
                unit_string[fnd] = '*';
                fnd = unit_string.find_first_of(spaceChars, fnd);
                skipMultiply = true;
                continue;
            }
            // if there was a single divide with no space then the next space is
            // probably a multiply
            if (std::count(
                    unit_string.begin(), unit_string.begin() + fnd, '/') == 1) {
                if (unit_string.rfind("/sq", fnd) == std::string::npos &&
                    unit_string.rfind("/cu", fnd) == std::string::npos) {
                    auto notspace =
                        unit_string.find_first_not_of(spaceChars, fnd);
                    auto f2 =
                        unit_string.find_first_of("*/^([{\xB7\xFA\xD7", fnd);
                    if (notspace != std::string::npos && f2 != notspace &&
                        !isDigitCharacter(unit_string[fnd - 1])) {
                        unit_string[fnd] = '*';

                        skipMultiply = true;
                        fnd = unit_string.find_first_of(spaceChars, fnd);
                        continue;
                    }
                }
            }
        }
        if (fnd > 0 && unit_string[fnd - 1] == '.') {
            // this now gets dealt with in the dotMultiply code
            ++fnd;
        } else {
            unit_string.erase(fnd, 1);
            if (fnd > 0) {
                skipMultiply = true;
            }
        }

        fnd = unit_string.find_first_of(spaceChars, fnd);
    }
    return spacesRemoved;
}